

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

void __thiscall Refal2::CArbitraryInteger::Sub(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  if (this->isNegative == operand->isNegative) {
    sub(this,operand);
  }
  else {
    add(this,operand);
  }
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Sub( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		sub( operand );
	} else {
		// result sign will be the same of first operand
		add( operand );
	}
	removeLeadingZeros();
}